

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-mpq.c
# Opt level: O0

int mpq_cmp_ui(__mpq_struct *q,unsigned_long n,unsigned_long d)

{
  int iVar1;
  mp_srcptr in_RDX;
  __mpq_struct *in_RSI;
  mp_size_t in_RDI;
  mp_limb_t dl;
  mp_limb_t nl;
  mpq_t t;
  mp_srcptr in_stack_ffffffffffffffa8;
  __mpq_struct *in_stack_ffffffffffffffd8;
  __mpq_struct *in_stack_ffffffffffffffe0;
  
  mpq_roinit_normal_nn(in_RSI,in_RDX,in_RDI,in_stack_ffffffffffffffa8,0x9aef6b);
  iVar1 = mpq_cmp(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return iVar1;
}

Assistant:

int
mpq_cmp_ui (const mpq_t q, unsigned long n, unsigned long d)
{
  mpq_t t;
  assert (d != 0);
  if (ULONG_MAX <= GMP_LIMB_MAX) {
    mp_limb_t nl = n, dl = d;
    return mpq_cmp (q, mpq_roinit_normal_nn (t, &nl, n != 0, &dl, 1));
  } else {
    int ret;

    mpq_nan_init (t);
    mpq_set_ui (t, n, d);
    ret = mpq_cmp (q, t);
    mpq_clear (t);

    return ret;
  }
}